

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

int Nwk_ManVerifyLevel(Nwk_Man_t *pNtk)

{
  uint uVar1;
  Nwk_Obj_t *pObj;
  uint i;
  
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= (int)i) {
      return 1;
    }
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if (pObj != (Nwk_Obj_t *)0x0) {
      if ((pObj->field_0x20 & 0x10) != 0) {
        __assert_fail("pObj->MarkA == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                      ,0x346,"int Nwk_ManVerifyLevel(Nwk_Man_t *)");
      }
      uVar1 = Nwk_ObjLevelNew(pObj);
      if (pObj->Level != uVar1) {
        printf("Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n",(ulong)i,
               (ulong)(uint)pObj->Level,(ulong)uVar1);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Nwk_ManVerifyLevel( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int LevelNew, i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        LevelNew = Nwk_ObjLevelNew( pObj );
        if ( Nwk_ObjLevel(pObj) != LevelNew )
        {
            printf( "Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n", 
                i, Nwk_ObjLevel(pObj), LevelNew );
        }
    }
    return 1;
}